

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,string *base58_data,ByteData256 *tweak_sum)

{
  CfdException *this_00;
  bool bVar1;
  allocator local_41;
  string local_40;
  
  Extkey::Extkey(&this->super_Extkey,base58_data,tweak_sum);
  bVar1 = Privkey::IsValid(&(this->super_Extkey).privkey_);
  if (!bVar1) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Invalid serialize data. this data is ExtPrivkey data.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey::ExtPubkey(
    const std::string& base58_data, const ByteData256& tweak_sum)
    : Extkey(base58_data, tweak_sum) {
  if (privkey_.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid serialize data. this data is ExtPrivkey data.");
  }
}